

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

DirUtils * __thiscall DirUtils::GetLastPath(DirUtils *this,string *p)

{
  char *pcVar1;
  int local_20;
  int i;
  int l;
  string *p_local;
  
  local_20 = std::__cxx11::string::length();
  do {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      std::__cxx11::string::string((string *)this,(string *)p);
      return this;
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)p);
  } while (*pcVar1 != '/');
  std::__cxx11::string::substr((ulong)this,(ulong)p);
  return this;
}

Assistant:

string DirUtils::GetLastPath(const string& p){
	int l = p.length();
	for(int i = l - 1; i >= 0; i--){
		if(p[i] == '/')
			return p.substr(i + 1, l - i - 1);
	}
	return p;
}